

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall
cfd::Psbt::AddTxOutData
          (Psbt *this,Amount *amount,Address *address,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  uint uVar1;
  vector *in_RCX;
  Script *in_RDI;
  wally_psbt *psbt_pointer;
  CfdException *except;
  uint32_t index;
  Amount local_68 [60];
  uint local_2c;
  vector *local_20;
  
  local_20 = in_RCX;
  cfd::core::Address::GetLockingScript();
  uVar1 = cfd::core::Psbt::AddTxOut(in_RDI,local_68);
  core::Script::~Script(in_RDI);
  local_2c = uVar1;
  cfd::core::Psbt::SetTxOutData((uint)in_RDI,(Script *)(ulong)uVar1,local_20);
  return 0;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const Script& redeem_script,
    const std::vector<KeyData>& key_list) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return 0;
}